

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

uint16_t parse_ncname(ly_ctx *ctx,char *ncname)

{
  bool bVar1;
  uint local_2c;
  int local_28;
  uint size;
  int uc;
  uint16_t parsed;
  char *ncname_local;
  ly_ctx *ctx_local;
  
  size._2_2_ = 0;
  _uc = ncname;
  ncname_local = (char *)ctx;
  local_28 = lyxml_getutf8(ctx,ncname,&local_2c);
  if ((((((((local_28 < 0x61) || (0x7a < local_28)) && (local_28 != 0x5f)) &&
         ((local_28 < 0x41 || (0x5a < local_28)))) && (local_28 != 0x3a)) &&
       ((((local_28 < 0x370 || (0x1fff < local_28)) || (local_28 == 0x37e)) &&
        ((((local_28 < 0xc0 || (0x2ff < local_28)) || (local_28 == 0xd7)) || (local_28 == 0xf7))))))
      && ((((local_28 != 0x200c && (local_28 != 0x200d)) &&
           (((local_28 < 0x2070 || (0x218f < local_28)) &&
            ((local_28 < 0x2c00 || (0x2fef < local_28)))))) &&
          (((local_28 < 0x3001 || (0xd7ff < local_28)) &&
           ((((local_28 < 0xf900 || (0xfdcf < local_28)) &&
             ((local_28 < 0xfdf0 || (0xfffd < local_28)))) &&
            ((local_28 < 0x10000 || (0xeffff < local_28)))))))))) || (local_28 == 0x3a)) {
    ctx_local._6_2_ = size._2_2_;
  }
  else {
    do {
      size._2_2_ = size._2_2_ + (short)local_2c;
      if (_uc[size._2_2_] == '\0') break;
      local_28 = lyxml_getutf8((ly_ctx *)ncname_local,_uc + size._2_2_,&local_2c);
      if ((((((((((0x60 < local_28) && (local_28 < 0x7b)) || (local_28 == 0x5f)) ||
               ((local_28 == 0x2d || ((0x40 < local_28 && (local_28 < 0x5b)))))) ||
              ((0x2f < local_28 && (local_28 < 0x3a)))) ||
             (((local_28 == 0x3a || (local_28 == 0x2e)) ||
              ((local_28 == 0xb7 ||
               (((0x36f < local_28 && (local_28 < 0x2000)) && (local_28 != 0x37e)))))))) ||
            (((0xbf < local_28 && (local_28 < 0x300)) && ((local_28 != 0xd7 && (local_28 != 0xf7))))
            )) || ((((local_28 == 0x200c || (local_28 == 0x200d)) ||
                    ((0x2ff < local_28 && (local_28 < 0x370)))) ||
                   (((0x206f < local_28 && (local_28 < 0x2190)) ||
                    ((0x2030e < local_28 && (local_28 < 0x2041)))))))) ||
          (((((0x2bff < local_28 && (local_28 < 0x2ff0)) ||
             ((0x3000 < local_28 && (local_28 < 0xd800)))) ||
            ((0xf8ff < local_28 && (local_28 < 0xfdd0)))) ||
           ((0xfdef < local_28 && (local_28 < 0xfffe)))))) ||
         ((bVar1 = false, 0xffff < local_28 && (bVar1 = false, local_28 < 0xf0000)))) {
        bVar1 = local_28 != 0x3a;
      }
    } while (bVar1);
    ctx_local._6_2_ = size._2_2_;
  }
  return ctx_local._6_2_;
}

Assistant:

static uint16_t
parse_ncname(struct ly_ctx *ctx, const char *ncname)
{
    uint16_t parsed = 0;
    int uc;
    unsigned int size;

    uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    if (!is_xmlnamestartchar(uc) || (uc == ':')) {
       return parsed;
    }

    do {
        parsed += size;
        if (!ncname[parsed]) {
            break;
        }
        uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    } while (is_xmlnamechar(uc) && (uc != ':'));

    return parsed;
}